

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O3

void ecs_bulk_add_entity(ecs_world_t *world,ecs_entity_t to_add,ecs_filter_t *filter)

{
  _Bool _Var1;
  int32_t iVar2;
  ecs_stage_t *peVar3;
  ecs_table_t *table;
  ecs_table_t *dst_table;
  int dense_index;
  ecs_entities_t added;
  ecs_entities_t to_add_array;
  ecs_entity_t added_entity;
  ecs_world_t *local_68;
  ecs_entities_t local_60;
  ecs_entities_t local_50;
  ecs_entity_t local_40;
  ecs_entity_t local_38;
  
  local_68 = world;
  local_40 = to_add;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xcf);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xcf,
                  "void ecs_bulk_add_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
  }
  _ecs_assert(to_add != 0,2,(char *)0x0,"to_add != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xd0);
  if (to_add != 0) {
    peVar3 = ecs_get_stage(&local_68);
    _ecs_assert(peVar3 == &local_68->stage,0x23,(char *)0x0,"stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xd3);
    if (peVar3 != &local_68->stage) {
      __assert_fail("stage == &world->stage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0xd3,
                    "void ecs_bulk_add_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
    }
    local_50.array = &local_40;
    local_50.count = 1;
    local_60.array = &local_38;
    local_60.count = 0;
    iVar2 = ecs_sparse_count((local_68->store).tables);
    if (0 < iVar2) {
      dense_index = 0;
      do {
        table = (ecs_table_t *)_ecs_sparse_get((local_68->store).tables,0x80,dense_index);
        if ((table->flags & 1) == 0) {
          _Var1 = ecs_table_match_filter(local_68,table,filter);
          if (_Var1) {
            dst_table = ecs_table_traverse_add(local_68,table,&local_50,&local_60);
            _ecs_assert(local_60.count <= local_50.count,0xc,(char *)0x0,
                        "added.count <= to_add_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0xed);
            if (local_50.count < local_60.count) {
              __assert_fail("added.count <= to_add_array.count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0xed,
                            "void ecs_bulk_add_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                           );
            }
            if (local_60.count != 0) {
              _ecs_assert(dst_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0xf3);
              if (dst_table == (ecs_table_t *)0x0) {
                __assert_fail("dst_table != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                              ,0xf3,
                              "void ecs_bulk_add_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                             );
              }
              merge_table(local_68,dst_table,table,&local_60,(ecs_entities_t *)0x0);
              local_60.count = 0;
            }
          }
        }
        dense_index = dense_index + 1;
      } while (iVar2 != dense_index);
    }
    return;
  }
  __assert_fail("to_add != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xd0,"void ecs_bulk_add_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)")
  ;
}

Assistant:

void ecs_bulk_add_entity(
    ecs_world_t *world,
    ecs_entity_t to_add,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_add != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = { .array = &to_add, .count = 1 };

    ecs_entity_t added_entity;
    ecs_entities_t added = {
        .array = &added_entity,
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }
        
        ecs_table_t *dst_table = ecs_table_traverse_add(
            world, table, &to_add_array, &added);

        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);
        
        if (!added.count) {
            continue;
        }         

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   
        merge_table(world, dst_table, table, &added, NULL);
        added.count = 0;
    }    
}